

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O1

LocalVector<unsigned_int> * __thiscall
limonp::LocalVector<unsigned_int>::operator=
          (LocalVector<unsigned_int> *this,LocalVector<unsigned_int> *vec)

{
  size_t sVar1;
  size_t sVar2;
  uint *__dest;
  
  if ((LocalVector<unsigned_int> *)this->ptr_ != this) {
    free((LocalVector<unsigned_int> *)this->ptr_);
  }
  this->ptr_ = this->buffer_;
  this->size_ = 0;
  this->capacity_ = 0x10;
  sVar1 = vec->size_;
  sVar2 = vec->capacity_;
  this->size_ = sVar1;
  this->capacity_ = sVar2;
  if ((LocalVector<unsigned_int> *)vec->ptr_ == vec) {
    memcpy(this,vec,sVar1 << 2);
    this->ptr_ = this->buffer_;
  }
  else {
    __dest = (uint *)malloc(vec->capacity_ << 2);
    this->ptr_ = __dest;
    if (__dest == (uint *)0x0) {
      __assert_fail("ptr_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x3e,
                    "LocalVector<T> &limonp::LocalVector<unsigned int>::operator=(const LocalVector<T> &) [T = unsigned int]"
                   );
    }
    memcpy(__dest,vec->ptr_,vec->size_ << 2);
  }
  return this;
}

Assistant:

LocalVector<T>& operator = (const LocalVector<T>& vec) {
    clear();
    size_ = vec.size();
    capacity_ = vec.capacity();
    if(vec.buffer_ == vec.ptr_) {
      memcpy(buffer_, vec.buffer_, sizeof(T) * size_);
      ptr_ = buffer_;
    } else {
      ptr_ = (T*) malloc(vec.capacity() * sizeof(T));
      assert(ptr_);
      memcpy(ptr_, vec.ptr_, vec.size() * sizeof(T));
    }
    return *this;
  }